

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  bool bVar2;
  long *plVar3;
  char *pcVar4;
  char *command;
  size_t sVar5;
  _Base_ptr p_Var6;
  string *psVar7;
  ostream *poVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  string *opt;
  undefined1 auVar11 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string langFlagRegexVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts_1;
  undefined1 local_1f8 [32];
  string *local_1d8;
  string *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1f8._0_8_ = (pointer)(local_1f8 + 0x10);
  local_1d8 = flags;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"CMAKE_","");
  plVar3 = (long *)std::__cxx11::string::_M_append(local_1f8,(ulong)(lang->_M_dataplus)._M_p);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 == paVar9) {
    local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_198[0]._8_8_ = plVar3[3];
    local_1a8 = (undefined1  [8])local_198;
  }
  else {
    local_198[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_1a8 = (undefined1  [8])*plVar3;
  }
  paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar3[1];
  *plVar3 = (long)paVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_1a8);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  psVar10 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c8.field_2._M_allocated_capacity = *psVar10;
    local_1c8.field_2._8_8_ = plVar3[3];
  }
  else {
    local_1c8.field_2._M_allocated_capacity = *psVar10;
    local_1c8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_1c8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  local_1d0 = lang;
  if ((pointer)local_1f8._0_8_ != (pointer)(local_1f8 + 0x10)) {
    operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
  }
  pcVar4 = cmMakefile::GetDefinition(this->Makefile,&local_1c8);
  if (pcVar4 == (char *)0x0) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"COMPILE_FLAGS","");
    pcVar4 = cmGeneratorTarget::GetProperty(target,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar4 != (char *)0x0) {
      (*this->_vptr_cmLocalGenerator[7])(this,local_1d8,pcVar4);
    }
    local_1a8 = (undefined1  [8])0x0;
    paStack_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    local_198[0]._M_allocated_capacity = 0;
    cmGeneratorTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1a8,config,local_1d0);
    paVar9 = paStack_1a0;
    for (auVar11 = local_1a8; auVar11 != (undefined1  [8])paVar9;
        auVar11 = (undefined1  [8])((long)auVar11 + 0x20)) {
      (*this->_vptr_cmLocalGenerator[8])(this,local_1d8,auVar11);
    }
    this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8;
  }
  else {
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    local_1f8._16_8_ = (pointer)0x0;
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"COMPILE_FLAGS","");
    command = cmGeneratorTarget::GetProperty(target,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if (command != (char *)0x0) {
      cmSystemTools::ParseWindowsCommandLine
                (command,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1f8);
    }
    cmGeneratorTarget::GetCompileOptions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1f8,config,local_1d0);
    AppendCompileOptions
              (this,local_1d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1f8,pcVar4);
    this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_01);
  p_Var6 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,*(long *)(p_Var6 + 1),
                 (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
      std::__cxx11::string::append((char *)local_1a8);
      pcVar4 = cmGeneratorTarget::GetProperty(target,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
      }
      if (pcVar4 != (char *)0x0) {
        this_00 = this->Makefile;
        local_1a8 = (undefined1  [8])local_198;
        sVar5 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar4,pcVar4 + sVar5);
        bVar2 = cmMakefile::IsLaterStandard
                          (this_00,(string *)(p_Var6 + 1),(string *)local_1a8,(string *)(p_Var6 + 2)
                          );
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"The COMPILE_FEATURES property of target \"",0x29);
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,
                              psVar7->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" was evaluated when computing the link implementation, and the \"",
                     0x41);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_STANDARD\" was \"",0x10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(p_Var6 + 2),(long)p_Var6[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                     ,0x6f);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_STANDARD\" \"",0xc);
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar4,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation."
                     ,0x75);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_1f8,
                              &this->DirectoryBacktrace);
          if ((pointer)local_1f8._0_8_ != (pointer)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          goto LAB_001a852b;
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  AddCompilerRequirementFlag(this,local_1d8,target,local_1d0);
LAB_001a852b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::string& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = std::string("CMAKE_") + lang + "_FLAG_REGEX";

  if (const char* langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    std::vector<std::string> opts;
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      cmSystemTools::ParseWindowsCommandLine(targetFlags, opts);
    }
    target->GetCompileOptions(opts, config, lang);
    // (Re-)Escape these flags.  COMPILE_FLAGS were already parsed
    // as a command line above, and COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, opts, langFlagRegexStr);
  } else {
    // Use all flags.
    if (const char* targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      this->AppendFlags(flags, targetFlags);
    }
    std::vector<std::string> opts;
    target->GetCompileOptions(opts, config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, opts);
  }

  for (auto const& it : target->GetMaxLanguageStandards()) {
    const char* standard = target->GetProperty(it.first + "_STANDARD");
    if (!standard) {
      continue;
    }
    if (this->Makefile->IsLaterStandard(it.first, standard, it.second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it.first << "_STANDARD\" was \"" << it.second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it.first << "_STANDARD\" \"" << standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation."
        << std::endl;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }
  this->AddCompilerRequirementFlag(flags, target, lang);
}